

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void out(int type,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4d8 [16];
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined4 local_428;
  undefined4 local_424;
  va_list list;
  char local_408 [8];
  char msg [1000];
  char *fmt_local;
  int type_local;
  
  if (in_AL != '\0') {
    local_4a8 = in_XMM0_Qa;
    local_498 = in_XMM1_Qa;
    local_488 = in_XMM2_Qa;
    local_478 = in_XMM3_Qa;
    local_468 = in_XMM4_Qa;
    local_458 = in_XMM5_Qa;
    local_448 = in_XMM6_Qa;
    local_438 = in_XMM7_Qa;
  }
  list[0].overflow_arg_area = local_4d8;
  list[0]._0_8_ = &stack0x00000008;
  local_424 = 0x30;
  local_428 = 0x10;
  local_4c8 = in_RDX;
  local_4c0 = in_RCX;
  local_4b8 = in_R8;
  local_4b0 = in_R9;
  vsnprintf(local_408,1000,fmt,&local_428);
  switch(type) {
  case 0:
    server::sendservmsg(local_408);
    ircBot::speak(&irc,local_408);
    puts(local_408);
    break;
  case 1:
    ircBot::speak(&irc,local_408);
    break;
  case 2:
    puts(local_408);
    break;
  case 3:
    server::sendservmsg(local_408);
    break;
  case 4:
    puts(local_408);
    ircBot::speak(&irc,local_408);
  }
  return;
}

Assistant:

void out(int type, const char *fmt, ...)
{
    char msg[1000];
    va_list list;
    va_start(list,fmt);
    vsnprintf(msg,1000,fmt,list);
    va_end(list);
    
    switch(type)
    {
        case ECHO_ALL:
        {
            server::sendservmsg(msg);
            irc.speak(msg);
            puts(msg);
            break;
        }
        case ECHO_IRC:
        {
            irc.speak(msg);
            break;
        }
        case ECHO_CONSOLE:
        {
            puts(msg);
            break;
        }
        case ECHO_SERV:
        {
            server::sendservmsg(msg);
            break;
        }
        case ECHO_NOCOLOR:
        {
            puts(msg);
            irc.speak(msg);
            break;
        }
        default:
            break;
    }
}